

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

Atlas * xatlas::Create(void)

{
  Context *this;
  TaskScheduler *this_00;
  char *in_RCX;
  int in_EDX;
  int extraout_EDX;
  int in_R8D;
  
  this = (Context *)internal::Realloc((void *)0x0,0x110,in_EDX,in_RCX,in_R8D);
  memset(this,0,0x110);
  Context::Context(this);
  (this->atlas).atlasCount = 0;
  (this->atlas).chartCount = 0;
  (this->atlas).meshCount = 0;
  (this->atlas).texelsPerUnit = 0.0;
  (this->atlas).utilization = (float *)0x0;
  (this->atlas).width = 0;
  (this->atlas).height = 0;
  (this->atlas).image = (uint32_t *)0x0;
  (this->atlas).meshes = (Mesh *)0x0;
  this_00 = (TaskScheduler *)internal::Realloc((void *)0x0,0x28,extraout_EDX,in_RCX,in_R8D);
  internal::TaskScheduler::TaskScheduler(this_00);
  this->taskScheduler = this_00;
  return &this->atlas;
}

Assistant:

Atlas *Create()
{
	Context *ctx = XA_NEW(internal::MemTag::Default, Context);
	memset(&ctx->atlas, 0, sizeof(Atlas));
	ctx->taskScheduler = XA_NEW(internal::MemTag::Default, internal::TaskScheduler);
	return &ctx->atlas;
}